

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O3

RC __thiscall QL_Manager::RunDelete(QL_Manager *this,QL_Node *topNode)

{
  int iVar1;
  int extraout_EAX;
  DataAttrInfo *attributes;
  Attr *pAVar2;
  RelCatEntry *pRVar3;
  long lVar4;
  IX_IndexHandle *this_00;
  RID rid;
  int attrListSize;
  char *pData;
  int finalTupLength;
  RM_Record rec;
  Printer printer;
  int *attrList;
  RM_FileHandle relFH;
  RID local_ec;
  int local_e4;
  char *local_e0;
  IX_IndexHandle *local_d8;
  Attr *local_d0;
  int local_c4;
  RM_Record local_c0;
  Printer local_a8;
  int *local_80;
  RM_FileHandle local_78;
  
  QL_Node::GetTupleLength(topNode,&local_c4);
  iVar1 = QL_Node::GetAttrList(topNode,&local_80,&local_e4);
  if (iVar1 == 0) {
    attributes = (DataAttrInfo *)malloc((long)local_e4 * 0x44);
    iVar1 = SetUpPrinter(this,topNode,attributes);
    if (iVar1 == 0) {
      Printer::Printer(&local_a8,attributes,local_e4);
      Printer::PrintHeader(&local_a8,(ostream *)&std::cout);
      RM_FileHandle::RM_FileHandle(&local_78);
      pAVar2 = (Attr *)malloc((long)this->relEntries->attrCount * 0x30);
      iVar1 = SetUpRun(this,pAVar2,&local_78);
      if (iVar1 == 0) {
        iVar1 = (**topNode->_vptr_QL_Node)(topNode);
        if (iVar1 == 0) {
          RM_Record::RM_Record(&local_c0);
          RID::RID(&local_ec);
          local_d8 = &pAVar2->ih;
          local_d0 = pAVar2;
          while( true ) {
            pAVar2 = local_d0;
            iVar1 = (*topNode->_vptr_QL_Node[2])(topNode,&local_c0);
            if (iVar1 != 0) break;
            iVar1 = RM_Record::GetRid(&local_c0,&local_ec);
            if ((iVar1 != 0) || (iVar1 = RM_Record::GetData(&local_c0,&local_e0), iVar1 != 0))
            goto LAB_0011114a;
            Printer::Print(&local_a8,(ostream *)&std::cout,local_e0);
            iVar1 = RM_FileHandle::DeleteRec(&local_78,&local_ec);
            if (iVar1 != 0) goto LAB_0011114a;
            pRVar3 = this->relEntries;
            if (0 < pRVar3->attrCount) {
              lVar4 = 0;
              this_00 = local_d8;
              do {
                if (*(int *)(this_00 + -4) != -1) {
                  IX_IndexHandle::DeleteEntry(this_00);
                  iVar1 = extraout_EAX;
                  if (extraout_EAX != 0) goto LAB_0011114a;
                  pRVar3 = this->relEntries;
                }
                lVar4 = lVar4 + 1;
                this_00 = this_00 + 0x30;
              } while (lVar4 < pRVar3->attrCount);
            }
          }
          if (((iVar1 == 0x199) && (iVar1 = (*topNode->_vptr_QL_Node[3])(topNode), iVar1 == 0)) &&
             (iVar1 = CleanUpRun(this,pAVar2,&local_78), iVar1 == 0)) {
            Printer::PrintFooter(&local_a8,(ostream *)&std::cout);
            free(attributes);
            iVar1 = 0;
          }
LAB_0011114a:
          RID::~RID(&local_ec);
          RM_Record::~RM_Record(&local_c0);
        }
      }
      else {
        SM_Manager::CleanUpAttr(this->smm,pAVar2,this->relEntries->attrCount);
      }
      RM_FileHandle::~RM_FileHandle(&local_78);
      Printer::~Printer(&local_a8);
    }
  }
  return iVar1;
}

Assistant:

RC QL_Manager::RunDelete(QL_Node *topNode){
  RC rc = 0;
  // Retrieves the list of attributes associated with this relation, and set up the
  // printer
  int finalTupLength, attrListSize;
  topNode->GetTupleLength(finalTupLength);
  int *attrList;
  if((rc = topNode->GetAttrList(attrList, attrListSize)))
    return (rc);
  DataAttrInfo * printAttributes = (DataAttrInfo *)malloc(attrListSize* sizeof(DataAttrInfo));
  if((rc = SetUpPrinter(topNode, printAttributes)))
    return (rc);
  Printer printer(printAttributes, attrListSize);
  printer.PrintHeader(cout);

  // Open the appropriate file, and Attr* list for holding IX_IndexHandles
  // for efficient index updates
  RM_FileHandle relFH;
  Attr* attributes = (Attr *)malloc(sizeof(Attr)*relEntries->attrCount);
  if((rc = SetUpRun(attributes, relFH))){
    smm.CleanUpAttr(attributes, relEntries->attrCount);
    return (rc);
  } 
  
  // Retrieves records
  if((rc = topNode->OpenIt() ))
    return (rc);

  RM_Record rec;
  RID rid;
  while(true){
    if((rc = topNode->GetNextRec(rec))){
      if (rc == QL_EOI){
        break;
      }
      return (rc);
    }
    char *pData;
    if((rc = rec.GetRid(rid)) || (rc = rec.GetData(pData)) )
      return (rc);
    printer.Print(cout, pData); // print out info about the attribute to delete
    if((rc = relFH.DeleteRec(rid))) // delete it
      return (rc);
    
    // Delete it from any index as well
    for(int i=0; i < relEntries->attrCount ; i++){
      if(attributes[i].indexNo != -1){
        if((rc = attributes[i].ih.DeleteEntry((void *)(pData + attributes[i].offset), rid)))
          return (rc);
      }
    }
  }
  
  if((rc = topNode->CloseIt()))
    return (rc);


  if((rc = CleanUpRun(attributes, relFH)))
    return (rc);

  printer.PrintFooter(cout);
  free(printAttributes);

  return (0);
}